

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.cc
# Opt level: O0

string_view bloaty::dwarf::AttrValue::ReadBlock<unsigned_char>(string_view *data)

{
  uchar uVar1;
  string_view sVar2;
  string_view sVar3;
  uchar len;
  string_view *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  uVar1 = ReadFixed<unsigned_char,1ul>
                    ((string_view *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  sVar2 = ReadBytes(CONCAT17(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  sVar3._M_len = sVar2._M_len;
  sVar3._M_str = sVar2._M_str;
  return sVar3;
}

Assistant:

string_view AttrValue::ReadBlock(string_view* data) {
  D len = ReadFixed<D>(data);
  return ReadBytes(len, data);
}